

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O1

QListWidgetItem * __thiscall QListWidget::itemFromIndex(QListWidget *this,QModelIndex *index)

{
  long lVar1;
  
  if (((-1 < index->r) && (-1 < index->c)) &&
     ((index->m).ptr ==
      *(QAbstractItemModel **)
       (*(long *)&(this->super_QListView).super_QAbstractItemView.super_QAbstractScrollArea.
                  super_QFrame.super_QWidget.field_0x8 + 0x2f8))) {
    lVar1 = QMetaObject::cast((QObject *)&QListModel::staticMetaObject);
    if ((ulong)(long)index->r < *(ulong *)(lVar1 + 0x20)) {
      return *(QListWidgetItem **)(*(long *)(lVar1 + 0x18) + (long)index->r * 8);
    }
  }
  return (QListWidgetItem *)0x0;
}

Assistant:

QListWidgetItem *QListWidget::itemFromIndex(const QModelIndex &index) const
{
    Q_D(const QListWidget);
    if (d->isIndexValid(index))
        return d->listModel()->at(index.row());
    return nullptr;
}